

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incbi.c
# Opt level: O2

double hcephes_incbi(double aa,double bb,double yy0)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  double dVar11;
  ulong uVar12;
  double dVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double local_118;
  double dStack_110;
  double local_100;
  undefined1 local_f8 [32];
  double local_d8;
  double local_c8;
  undefined8 local_b8;
  double local_a8;
  double local_98;
  undefined1 local_88 [16];
  double dStack_60;
  double local_50;
  double local_48;
  double dStack_40;
  
  auVar18._8_4_ = in_XMM0_Dc;
  auVar18._0_8_ = aa;
  auVar18._12_4_ = in_XMM0_Dd;
  dVar21 = 0.0;
  if ((yy0 <= 0.0) || (dVar21 = 1.0, 1.0 <= yy0)) {
    return dVar21;
  }
  dStack_60 = auVar18._8_8_;
  local_100 = yy0;
  local_b8 = bb;
  if ((aa <= 1.0) || (bb <= 1.0)) {
    local_118 = aa / (aa + bb);
    local_a8 = hcephes_incbet(aa,bb,local_118);
    uVar12 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
    bVar4 = true;
    bVar2 = false;
    local_50 = 1e-06;
    local_f8._0_16_ = ZEXT816(0);
    local_c8 = 1.0;
    dVar21 = 0.0;
    local_88 = ZEXT816(0);
    local_d8 = 1.0;
    local_98 = aa;
    goto LAB_00105517;
  }
  dVar21 = hcephes_ndtri(yy0);
  if (yy0 <= 0.5) {
    dVar21 = -dVar21;
    dStack_60 = aa;
  }
  else {
    local_100 = 1.0 - yy0;
    local_b8 = aa;
    dStack_60 = bb;
  }
  bVar2 = yy0 > 0.5;
  auVar17._0_8_ = dVar21 * dVar21 + -3.0;
  dVar11 = dStack_60 + dStack_60 + -1.0;
  auVar20._8_4_ = SUB84(dVar11,0);
  auVar20._0_8_ = local_b8 + local_b8 + -1.0;
  auVar20._12_4_ = (int)((ulong)dVar11 >> 0x20);
  auVar20 = divpd(_DAT_00109490,auVar20);
  dVar11 = auVar20._8_8_ + auVar20._0_8_;
  auVar17._8_8_ = 0x4000000000000000;
  auVar1._8_4_ = SUB84(dVar11,0);
  auVar1._0_8_ = 0x4018000000000000;
  auVar1._12_4_ = (int)((ulong)dVar11 >> 0x20);
  auVar18 = divpd(auVar17,auVar1);
  dVar19 = auVar18._8_8_;
  dVar11 = dVar19 + auVar18._0_8_;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar21 = (dVar21 * dVar11) / dVar19 -
           (auVar20._0_8_ - auVar20._8_8_) *
           (auVar18._0_8_ + 0.8333333333333334 + -2.0 / (dVar19 * 3.0));
  dVar21 = dVar21 + dVar21;
  if (dVar21 < -745.1332191019412) {
LAB_00105405:
    hcephes_mtherr("incbi",4);
    if (bVar2) {
      return 0.9999999999999999;
    }
    return 0.0;
  }
  dVar21 = exp(dVar21);
  local_118 = dStack_60 / (dVar21 * local_b8 + dStack_60);
  local_a8 = hcephes_incbet(dStack_60,local_b8,local_118);
  uVar12 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
  local_f8._0_16_ = ZEXT816(0);
  local_98 = dStack_60;
  if (0.2 <= ABS((local_a8 - local_100) / local_100)) {
    bVar4 = true;
    local_50 = 0.0001;
    local_c8 = 1.0;
    dVar21 = 0.0;
    local_88 = ZEXT816(0);
    local_d8 = 1.0;
    goto LAB_00105517;
  }
  local_d8 = 1.0;
  local_c8 = 1.0;
  local_48 = 0.0;
  dStack_40 = 0.0;
  local_b8._4_4_ = (undefined4)((ulong)local_b8 >> 0x20);
  dStack_110 = dStack_60;
LAB_001058e0:
  local_88 = local_f8._0_16_;
  dVar11 = hcephes_lgam((double)CONCAT44(local_b8._4_4_,(undefined4)local_b8) + local_98);
  dVar19 = hcephes_lgam(local_98);
  dVar13 = hcephes_lgam(local_b8);
  iVar6 = 0;
  local_50 = 2.842170943040401e-14;
  local_f8._8_8_ = dStack_40;
  local_f8._0_8_ = local_48;
  bVar4 = false;
  do {
    uVar14 = 0;
    dVar16 = local_a8;
    if (iVar6 != 0) {
      dStack_60 = dStack_110;
      if (iVar6 == 8) goto LAB_00105cb0;
      dVar16 = hcephes_incbet(local_98,local_b8,local_118);
      uVar14 = CONCAT44(extraout_XMM0_Dd_03,extraout_XMM0_Dc_03);
    }
    dVar21 = 0.0;
    local_a8 = local_88._0_8_;
    uVar12 = local_88._8_8_;
    dVar15 = (double)local_f8._0_8_;
    dStack_60 = (double)local_f8._8_8_;
    if (local_a8 <= dVar16) {
      uVar7 = SUB84(local_d8,0);
      uVar8 = (undefined4)((ulong)local_d8 >> 0x20);
      if (dVar16 <= local_d8) {
        uVar7 = SUB84(dVar16,0);
        uVar8 = (undefined4)((ulong)dVar16 >> 0x20);
        uVar9 = (undefined4)uVar14;
        uVar10 = (undefined4)(uVar14 >> 0x20);
        if (local_100 <= dVar16) {
          uVar7 = local_88._0_4_;
          uVar8 = local_88._4_4_;
          uVar9 = local_88._8_4_;
          uVar10 = local_88._12_4_;
          local_c8 = local_118;
          dVar21 = dStack_110;
          local_d8 = dVar16;
        }
        local_f8._8_8_ = ~uVar14 & local_f8._8_8_ | uVar14 & (ulong)dStack_110;
        local_f8._0_8_ =
             ~-(ulong)(dVar16 < local_100) & local_f8._0_8_ |
             -(ulong)(dVar16 < local_100) & (ulong)local_118;
        local_88._4_4_ = uVar8;
        local_88._0_4_ = uVar7;
        local_88._12_4_ = uVar10;
        local_88._8_4_ = uVar9;
        local_a8 = dVar16;
        uVar12 = uVar14;
        dVar15 = local_118;
        dStack_60 = dStack_110;
        goto LAB_00105a72;
      }
      uVar12 = 0;
      dStack_60 = 0.0;
      local_a8 = local_d8;
      local_118 = local_c8;
    }
    else {
LAB_00105a72:
      uVar7 = SUB84(local_d8,0);
      uVar8 = (undefined4)((ulong)local_d8 >> 0x20);
      local_118 = dVar15;
    }
    local_d8 = (double)CONCAT44(uVar8,uVar7);
    if (((local_118 == 1.0) && (!NAN(local_118))) || ((local_118 == 0.0 && (!NAN(local_118)))))
    goto LAB_00105517;
    dVar21 = log(local_118);
    dVar16 = log(1.0 - local_118);
    dVar21 = dVar21 * (local_98 + -1.0) + dVar16 * (local_b8 + -1.0) + ((dVar11 - dVar19) - dVar13);
    if (dVar21 < -745.1332191019412) goto LAB_00105c30;
    if (709.782712893384 < dVar21) {
      dStack_60 = 0.0;
      goto LAB_00105cb0;
    }
    dVar21 = exp(dVar21);
    dVar21 = (local_a8 - local_100) / dVar21;
    dVar16 = local_118 - dVar21;
    if (dVar16 <= (double)local_f8._0_8_) {
      local_a8 = (local_118 - (double)local_f8._0_8_) / (local_c8 - (double)local_f8._0_8_);
      dVar16 = local_a8 * 0.5 * (local_118 - (double)local_f8._0_8_) + (double)local_f8._0_8_;
      if (dVar16 <= 0.0) break;
    }
    if (local_c8 <= dVar16) {
      local_a8 = (local_c8 - local_118) / (local_c8 - (double)local_f8._0_8_);
      dVar16 = local_a8 * -0.5 * (local_c8 - local_118) + local_c8;
      if (1.0 <= dVar16) break;
    }
    local_118 = dVar16;
    dStack_110 = 0.0;
    iVar6 = iVar6 + 1;
    if (ABS(dVar21 / local_118) < 1.4210854715202004e-14) {
LAB_00105c30:
      if (!bVar2) {
        return local_118;
      }
      if (local_118 <= 1.1102230246251565e-16) {
        return 0.9999999999999999;
      }
      return 1.0 - local_118;
    }
  } while( true );
  dStack_60 = 0.0;
LAB_00105cb0:
  uVar12 = 0;
  bVar4 = false;
  dVar21 = 0.0;
LAB_00105517:
  local_48 = (double)local_f8._0_8_;
  dStack_40 = (double)local_f8._8_8_;
  local_f8._0_16_ = local_88;
LAB_00105548:
  iVar6 = 0;
  dVar11 = 0.5;
  uVar7 = 0;
  uVar8 = 0;
  uVar5 = 0;
  do {
    uVar9 = uVar7;
    uVar10 = uVar8;
    if (iVar6 != 0) {
      if (iVar6 == 100) {
        hcephes_mtherr("incbi",6);
        if (1.0 <= local_48) {
          local_118 = 0.9999999999999999;
          goto LAB_00105c30;
        }
        if (local_118 <= 0.0) goto LAB_00105405;
      }
      else {
        dVar13 = local_c8 - local_48;
        dVar19 = dVar11 * dVar13 + local_48;
        uVar12 = -(ulong)(dVar19 == 1.0);
        dStack_60 = (double)(~CONCAT44(uVar8,uVar7) & CONCAT44(uVar8,uVar7));
        local_118 = (double)(uVar12 & 0x3fefffffffffffff | ~uVar12 & (ulong)dVar19);
        if ((local_118 == 0.0) && (!NAN(local_118))) {
          local_118 = dVar13 * 0.5 + local_48;
          dVar11 = 0.5;
          dStack_60 = dVar21;
          if ((local_118 == 0.0) && (!NAN(local_118))) goto LAB_00105405;
        }
        local_a8 = hcephes_incbet(local_98,local_b8,local_118);
        dVar21 = 0.0;
        uVar12 = CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01);
        if (local_50 <= ABS(dVar13 / (local_48 + local_c8))) {
          uVar9 = 0;
          uVar10 = 0;
          if (local_50 <= ABS((local_a8 - local_100) / local_100)) goto LAB_001056aa;
        }
      }
      dStack_110 = dStack_60;
      if (!bVar4) goto LAB_00105c30;
      goto LAB_001058e0;
    }
LAB_001056aa:
    if (local_100 <= local_a8) {
      if ((bVar2) && (local_118 < 1.1102230246251565e-16)) {
        return 0.9999999999999999;
      }
      uVar7 = 0;
      uVar8 = 0;
      uVar3 = 0;
      dVar21 = 0.5;
      if ((int)uVar5 < 1) {
        uVar7 = uVar9;
        uVar8 = uVar10;
        uVar3 = uVar5;
        if ((int)uVar5 < -3) {
          dVar21 = dVar11 * dVar11;
        }
        else if ((int)uVar5 < -1) {
          dVar21 = dVar11 * 0.5;
        }
        else {
          uVar7 = (int)uVar12;
          uVar8 = (int)(uVar12 >> 0x20);
          dVar21 = (local_a8 - local_100) / (local_a8 - (double)local_f8._0_8_);
        }
      }
      dVar11 = dVar21;
      uVar5 = uVar3 - 1;
      local_c8 = local_118;
      dVar21 = dStack_60;
      local_d8 = local_a8;
    }
    else {
      if ((int)uVar5 < 0) {
        uVar5 = 0;
        dVar11 = 0.5;
        uVar9 = 0;
        uVar10 = 0;
      }
      else if (uVar5 < 4) {
        if (uVar5 < 2) {
          uVar9 = 0;
          uVar10 = 0;
          dVar11 = (local_100 - local_a8) / (local_d8 - local_a8);
        }
        else {
          dVar11 = dVar11 * 0.5 + 0.5;
        }
      }
      else {
        uVar9 = 0;
        uVar10 = 0;
        dVar11 = 1.0 - (1.0 - dVar11) * (1.0 - dVar11);
      }
      if (0.75 < local_118) break;
      uVar5 = uVar5 + 1;
      local_f8._8_8_ = uVar12;
      local_f8._0_8_ = local_a8;
      uVar7 = uVar9;
      uVar8 = uVar10;
      local_48 = local_118;
      dStack_40 = dStack_60;
    }
    iVar6 = iVar6 + 1;
  } while( true );
  bVar2 = !bVar2;
  local_98 = aa;
  local_100 = yy0;
  local_b8 = bb;
  if (bVar2) {
    local_98 = bb;
    local_100 = 1.0 - yy0;
    local_b8 = aa;
  }
  local_118 = 1.0 - local_118;
  local_a8 = hcephes_incbet(local_98,local_b8,local_118);
  uVar12 = CONCAT44(extraout_XMM0_Dd_02,extraout_XMM0_Dc_02);
  local_48 = 0.0;
  dStack_40 = 0.0;
  dStack_60 = 0.0;
  local_c8 = 1.0;
  dVar21 = 0.0;
  local_f8._0_16_ = ZEXT816(0);
  local_d8 = 1.0;
  goto LAB_00105548;
}

Assistant:

HCEPHES_API double hcephes_incbi(double aa, double bb, double yy0) {
    double a, b, y0, d, y, x, x0, x1, lgm, yp, di, dithresh, yl, yh, xt;
    int i, rflg, dir, nflg;

    i = 0;
    if (yy0 <= 0)
        return (0.0);
    if (yy0 >= 1.0)
        return (1.0);
    x0 = 0.0;
    yl = 0.0;
    x1 = 1.0;
    yh = 1.0;
    nflg = 0;

    if (aa <= 1.0 || bb <= 1.0) {
        dithresh = 1.0e-6;
        rflg = 0;
        a = aa;
        b = bb;
        y0 = yy0;
        x = a / (a + b);
        y = hcephes_incbet(a, b, x);
        goto ihalve;
    } else {
        dithresh = 1.0e-4;
    }
    /* approximation to inverse function */

    yp = -hcephes_ndtri(yy0);

    if (yy0 > 0.5) {
        rflg = 1;
        a = bb;
        b = aa;
        y0 = 1.0 - yy0;
        yp = -yp;
    } else {
        rflg = 0;
        a = aa;
        b = bb;
        y0 = yy0;
    }

    lgm = (yp * yp - 3.0) / 6.0;
    x = 2.0 / (1.0 / (2.0 * a - 1.0) + 1.0 / (2.0 * b - 1.0));
    d = yp * sqrt(x + lgm) / x - (1.0 / (2.0 * b - 1.0) - 1.0 / (2.0 * a - 1.0)) *
                                     (lgm + 5.0 / 6.0 - 2.0 / (3.0 * x));
    d = 2.0 * d;
    if (d < HCEPHES_MINLOG) {
        x = 1.0;
        goto under;
    }
    x = a / (a + b * exp(d));
    y = hcephes_incbet(a, b, x);
    yp = (y - y0) / y0;
    if (fabs(yp) < 0.2)
        goto newt;

/* Resort to interval halving if not close enough. */
ihalve:

    dir = 0;
    di = 0.5;
    for (i = 0; i < 100; i++) {
        if (i != 0) {
            x = x0 + di * (x1 - x0);
            if (x == 1.0)
                x = 1.0 - HCEPHES_MACHEP;
            if (x == 0.0) {
                di = 0.5;
                x = x0 + di * (x1 - x0);
                if (x == 0.0)
                    goto under;
            }
            y = hcephes_incbet(a, b, x);
            yp = (x1 - x0) / (x1 + x0);
            if (fabs(yp) < dithresh)
                goto newt;
            yp = (y - y0) / y0;
            if (fabs(yp) < dithresh)
                goto newt;
        }
        if (y < y0) {
            x0 = x;
            yl = y;
            if (dir < 0) {
                dir = 0;
                di = 0.5;
            } else if (dir > 3)
                di = 1.0 - (1.0 - di) * (1.0 - di);
            else if (dir > 1)
                di = 0.5 * di + 0.5;
            else
                di = (y0 - y) / (yh - yl);
            dir += 1;
            if (x0 > 0.75) {
                if (rflg == 1) {
                    rflg = 0;
                    a = aa;
                    b = bb;
                    y0 = yy0;
                } else {
                    rflg = 1;
                    a = bb;
                    b = aa;
                    y0 = 1.0 - yy0;
                }
                x = 1.0 - x;
                y = hcephes_incbet(a, b, x);
                x0 = 0.0;
                yl = 0.0;
                x1 = 1.0;
                yh = 1.0;
                goto ihalve;
            }
        } else {
            x1 = x;
            if (rflg == 1 && x1 < HCEPHES_MACHEP) {
                x = 0.0;
                goto done;
            }
            yh = y;
            if (dir > 0) {
                dir = 0;
                di = 0.5;
            } else if (dir < -3)
                di = di * di;
            else if (dir < -1)
                di = 0.5 * di;
            else
                di = (y - y0) / (yh - yl);
            dir -= 1;
        }
    }
    hcephes_mtherr("incbi", HCEPHES_PLOSS);
    if (x0 >= 1.0) {
        x = 1.0 - HCEPHES_MACHEP;
        goto done;
    }
    if (x <= 0.0) {
    under:
        hcephes_mtherr("incbi", HCEPHES_UNDERFLOW);
        x = 0.0;
        goto done;
    }

newt:

    if (nflg)
        goto done;
    nflg = 1;
    lgm = hcephes_lgam(a + b) - hcephes_lgam(a) - hcephes_lgam(b);

    for (i = 0; i < 8; i++) {
        /* Compute the function at this point. */
        if (i != 0)
            y = hcephes_incbet(a, b, x);
        if (y < yl) {
            x = x0;
            y = yl;
        } else if (y > yh) {
            x = x1;
            y = yh;
        } else if (y < y0) {
            x0 = x;
            yl = y;
        } else {
            x1 = x;
            yh = y;
        }
        if (x == 1.0 || x == 0.0)
            break;
        /* Compute the derivative of the function at this point. */
        d = (a - 1.0) * log(x) + (b - 1.0) * log(1.0 - x) + lgm;
        if (d < HCEPHES_MINLOG)
            goto done;
        if (d > HCEPHES_MAXLOG)
            break;
        d = exp(d);
        /* Compute the step to the next approximation of x. */
        d = (y - y0) / d;
        xt = x - d;
        if (xt <= x0) {
            y = (x - x0) / (x1 - x0);
            xt = x0 + 0.5 * y * (x - x0);
            if (xt <= 0.0)
                break;
        }
        if (xt >= x1) {
            y = (x1 - x) / (x1 - x0);
            xt = x1 - 0.5 * y * (x1 - x);
            if (xt >= 1.0)
                break;
        }
        x = xt;
        if (fabs(d / x) < 128.0 * HCEPHES_MACHEP)
            goto done;
    }
    /* Did not converge.  */
    dithresh = 256.0 * HCEPHES_MACHEP;
    goto ihalve;

done:

    if (rflg) {
        if (x <= HCEPHES_MACHEP)
            x = 1.0 - HCEPHES_MACHEP;
        else
            x = 1.0 - x;
    }
    return (x);
}